

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlerRegistration.h
# Opt level: O3

void registerHandlers(MessageHandler *messageHandler)

{
  RequestHandler *pRVar1;
  NotificationHandler *pNVar2;
  
  pRVar1 = (RequestHandler *)operator_new(0x18);
  (pRVar1->super_Handler).type = Request;
  pRVar1->method = "initialize";
  (pRVar1->super_Handler)._vptr_Handler = (_func_int **)&PTR_registerCapabilities_00216520;
  MessageHandler::registerHandler(messageHandler,pRVar1);
  pNVar2 = (NotificationHandler *)operator_new(0x18);
  (pNVar2->super_Handler).type = Notification;
  pNVar2->method = "textDocument/didChange";
  (pNVar2->super_Handler)._vptr_Handler = (_func_int **)&PTR_registerCapabilities_00216b38;
  MessageHandler::registerHandler(messageHandler,pNVar2);
  pNVar2 = (NotificationHandler *)operator_new(0x18);
  (pNVar2->super_Handler).type = Notification;
  pNVar2->method = "textDocument/didOpen";
  (pNVar2->super_Handler)._vptr_Handler = (_func_int **)&PTR_registerCapabilities_00216ca0;
  MessageHandler::registerHandler(messageHandler,pNVar2);
  pRVar1 = (RequestHandler *)operator_new(0x18);
  (pRVar1->super_Handler).type = Request;
  pRVar1->method = "textDocument/documentSymbol";
  (pRVar1->super_Handler)._vptr_Handler = (_func_int **)&PTR_registerCapabilities_00216d48;
  MessageHandler::registerHandler(messageHandler,pRVar1);
  pRVar1 = (RequestHandler *)operator_new(0x18);
  (pRVar1->super_Handler).type = Request;
  pRVar1->method = "shutdown";
  (pRVar1->super_Handler)._vptr_Handler = (_func_int **)&PTR_registerCapabilities_00216c30;
  MessageHandler::registerHandler(messageHandler,pRVar1);
  pRVar1 = (RequestHandler *)operator_new(0x18);
  (pRVar1->super_Handler).type = Request;
  pRVar1->method = "textDocument/completion";
  (pRVar1->super_Handler)._vptr_Handler = (_func_int **)&PTR_registerCapabilities_00216c68;
  MessageHandler::registerHandler(messageHandler,pRVar1);
  return;
}

Assistant:

void registerHandlers (MessageHandler *messageHandler) {
    messageHandler->registerHandler(new InitializeHandler());
    messageHandler->registerHandler(new FileChangeHandler());
    messageHandler->registerHandler(new FileOpenHandler());
    messageHandler->registerHandler(new OutlineHandler());
    messageHandler->registerHandler(new ShutDownHandler());
    messageHandler->registerHandler(new CompletionProvider());
}